

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O0

int __thiscall ircBot::speak(ircBot *this,char *fmt,...)

{
  int __fd;
  char in_AL;
  size_t __n;
  ssize_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined4 local_818;
  undefined4 local_814;
  va_list list;
  char local_7f8 [8];
  char k [1000];
  char local_408 [8];
  char Amsg [1000];
  char *fmt_local;
  ircBot *this_local;
  
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  list[0].overflow_arg_area = local_8c8;
  list[0]._0_8_ = &stack0x00000008;
  local_814 = 0x30;
  local_818 = 0x10;
  local_8b8 = in_RDX;
  local_8b0 = in_RCX;
  local_8a8 = in_R8;
  local_8a0 = in_R9;
  vsnprintf(local_7f8,1000,fmt,&local_818);
  snprintf(local_408,1000,"PRIVMSG %s :%s\r\n",ircchan,local_7f8);
  __fd = this->sock;
  __n = strlen(local_408);
  sVar1 = send(__fd,local_408,__n,0);
  return (int)sVar1;
}

Assistant:

int ircBot::speak(const char *fmt, ...){
    char Amsg[1000], k[1000];
    va_list list;
    va_start(list,fmt);
    vsnprintf(k,1000,fmt,list);
    snprintf(Amsg,1000,"PRIVMSG %s :%s\r\n", ircchan, k);
    va_end(list);
    
    return send(sock,Amsg,strlen(Amsg),0);
}